

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_decimal_result<char_*>
fmt::v10::detail::format_decimal<char,unsigned_long>(char *out,unsigned_long value,int size)

{
  format_decimal_result<char_*> fVar1;
  int iVar2;
  char *pcVar3;
  int in_EDX;
  ulong in_RSI;
  long in_RDI;
  char *end;
  undefined8 in_stack_ffffffffffffff98;
  int line;
  char *pcVar4;
  char *in_stack_ffffffffffffffa0;
  ulong local_40;
  char *local_38;
  char *local_30;
  
  line = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  iVar2 = count_digits(0x366564);
  if (iVar2 <= in_EDX) {
    local_38 = (char *)(in_RDI + in_EDX);
    for (local_40 = in_RSI; 99 < local_40; local_40 = local_40 / 100) {
      local_38 = local_38 + -2;
      pcVar4 = local_38;
      pcVar3 = digits2(local_40 % 100);
      *(undefined2 *)pcVar4 = *(undefined2 *)pcVar3;
    }
    if (local_40 < 10) {
      local_30 = local_38 + -1;
      local_38[-1] = (char)local_40 + '0';
    }
    else {
      local_30 = local_38 + -2;
      pcVar4 = local_30;
      pcVar3 = digits2(local_40);
      *(undefined2 *)pcVar4 = *(undefined2 *)pcVar3;
    }
    fVar1.end = (char *)(in_RDI + in_EDX);
    fVar1.begin = local_30;
    return fVar1;
  }
  assert_fail(in_stack_ffffffffffffffa0,line,(char *)0x366588);
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}